

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_MappingTag::ON_MappingTag(ON_MappingTag *this,ON_TextureMapping *mapping,ON_Xform *xform)

{
  bool bVar1;
  ON_Xform *xform_local;
  ON_TextureMapping *mapping_local;
  ON_MappingTag *this_local;
  
  (this->m_mapping_id).Data1 = 0;
  (this->m_mapping_id).Data2 = 0;
  (this->m_mapping_id).Data3 = 0;
  (this->m_mapping_id).Data4[0] = '\0';
  (this->m_mapping_id).Data4[1] = '\0';
  (this->m_mapping_id).Data4[2] = '\0';
  (this->m_mapping_id).Data4[3] = '\0';
  (this->m_mapping_id).Data4[4] = '\0';
  (this->m_mapping_id).Data4[5] = '\0';
  (this->m_mapping_id).Data4[6] = '\0';
  (this->m_mapping_id).Data4[7] = '\0';
  this->m_mapping_type = no_mapping;
  this->m_mapping_crc = 0;
  memcpy(&this->m_mesh_xform,&ON_Xform::IdentityTransformation,0x80);
  Default(this);
  Set(this,mapping);
  bVar1 = TransformTreatedIsIdentity(xform);
  if (!bVar1) {
    memcpy(&this->m_mesh_xform,xform,0x80);
  }
  return;
}

Assistant:

ON_MappingTag::ON_MappingTag(const ON_TextureMapping & mapping, const ON_Xform * xform)
{
  Default();
  Set(mapping);
  if ( false == ON_MappingTag::TransformTreatedIsIdentity(xform))
    m_mesh_xform = *xform;
}